

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int parse_escaped_codepoint(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  int local_1c;
  int low;
  int val;
  xmlRegParserCtxtPtr ctxt_local;
  
  local_1c = parse_escaped_codeunit(ctxt);
  if ((0xd7ff < local_1c) && (local_1c < 0xdc00)) {
    ctxt->cur = ctxt->cur + 1;
    if ((*ctxt->cur == '\\') &&
       (((ctxt->cur = ctxt->cur + 1, *ctxt->cur == 'u' &&
         (iVar1 = parse_escaped_codeunit(ctxt), 0xdbff < iVar1)) && (iVar1 < 0xe000)))) {
      return (local_1c + -0xd800) * 0x400 + iVar1 + 0x2400;
    }
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"Invalid low surrogate pair code unit");
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

static int parse_escaped_codepoint(xmlRegParserCtxtPtr ctxt)
{
    int val = parse_escaped_codeunit(ctxt);
    if (0xD800 <= val && val <= 0xDBFF) {
	NEXT;
	if (CUR == '\\') {
	    NEXT;
	    if (CUR == 'u') {
		int low = parse_escaped_codeunit(ctxt);
		if (0xDC00 <= low && low <= 0xDFFF) {
		    return (val - 0xD800) * 0x400 + (low - 0xDC00) + 0x10000;
		}
	    }
	}
	ERROR("Invalid low surrogate pair code unit");
	val = -1;
    }
    return val;
}